

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

void __thiscall
pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>::
SampleTmaj<pbrt::VolPathIntegrator::SampleLd(pbrt::Interaction_const&,pbrt::BSDF_const*,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&)const::__0>
          (GeneralMedium<pbrt::NanoVDBMediumProvider> *this,Ray *rRender,Float raytMax,RNG *rng,
          SampledWavelengths *lambda,anon_class_32_4_b07b4888 callback)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Transform *this_00;
  float *pfVar4;
  const_reference pvVar5;
  Float *pFVar6;
  Ray *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  type tVar7;
  float fVar8;
  float fVar9;
  Float FVar10;
  ulong extraout_XMM0_Qb;
  undefined1 auVar31 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  Vector3<float> VVar46;
  Point3f PVar47;
  Point3<float> PVar48;
  SampledSpectrum SVar49;
  MediumInteraction intr;
  SampledSpectrum Le;
  SampledSpectrum density;
  SampledSpectrum Tmaj;
  Point3f p;
  Float t;
  Float uEnd;
  SampledSpectrum sigma_maj;
  Float maxDensity;
  int offset;
  Float t1;
  int stepAxis;
  int cmpToAxis [8];
  int bits;
  Float u;
  Float t0;
  Float nextVoxelPos_1;
  Float nextVoxelPos;
  int axis;
  Vector3f voxelWidth;
  int voxel [3];
  int voxelLimit [3];
  int step [3];
  float deltaT [3];
  float nextCrossingT [3];
  Point3f gridIntersect;
  Ray rayGrid;
  Vector3f diag;
  SampledSpectrum sigma_t;
  SampledSpectrum sigma_s;
  SampledSpectrum sigma_a;
  Float tMax;
  Float tMin;
  Ray ray;
  GeneralMedium<pbrt::NanoVDBMediumProvider> *in_stack_fffffffffffff9b8;
  MediumSample *in_stack_fffffffffffff9c0;
  MediumInteraction *in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9d0;
  byte in_stack_fffffffffffff9d7;
  SampledWavelengths *in_stack_fffffffffffff9d8;
  Ray *in_stack_fffffffffffff9e0;
  Float *in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  MediumSample *pMVar50;
  undefined4 in_stack_fffffffffffff9f8;
  Float in_stack_fffffffffffff9fc;
  Ray *in_stack_fffffffffffffa00;
  Bounds3<float> *in_stack_fffffffffffffa08;
  MediumInteraction *in_stack_fffffffffffffa10;
  SampledSpectrum *in_stack_fffffffffffffa20;
  MediumHandle *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  float in_stack_fffffffffffffa40;
  float in_stack_fffffffffffffa44;
  float in_stack_fffffffffffffa48;
  float in_stack_fffffffffffffa4c;
  float in_stack_fffffffffffffa60;
  float in_stack_fffffffffffffa64;
  float in_stack_fffffffffffffa68;
  float in_stack_fffffffffffffa6c;
  undefined4 uVar51;
  undefined4 uVar52;
  SampledWavelengths *lambda_00;
  Point3f *p_00;
  NanoVDBMediumProvider *this_01;
  Ray *r;
  MediumInteraction local_548;
  Interval<float> in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  Point3f local_408 [12];
  undefined1 local_370 [32];
  DenselySampledSpectrum local_350;
  undefined1 local_328 [24];
  memory_resource *local_310;
  float local_308;
  float local_234;
  float local_230;
  Float local_22c;
  undefined1 local_228 [32];
  MediumHandle local_208;
  Float aFStack_200 [2];
  polymorphic_allocator<float> pStack_1f8;
  float *pfStack_1f0;
  uint local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  int local_1cc;
  Tuple3<pbrt::Vector3,_float> local_1c8;
  int local_1bc [9];
  float afStack_198 [4];
  float local_188;
  float local_184;
  Tuple3<pbrt::Point3,_float> local_180;
  Tuple3<pbrt::Point3,_float> local_16c;
  undefined1 local_160 [32];
  undefined1 local_140 [56];
  GridHandleBase local_108;
  float local_100;
  size_t local_f8;
  uint8_t *local_f0;
  FloatGrid *local_e8;
  FloatGrid *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  float local_a8;
  float local_a4;
  undefined8 local_98;
  float local_90;
  undefined8 local_84;
  float local_7c;
  float local_14;
  Ray *local_10;
  undefined1 auVar45 [56];
  
  FVar10 = (Float)((ulong)in_stack_fffffffffffff9f0 >> 0x20);
  pFVar6 = (Float *)&stack0x00000008;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  tVar7 = Length<float>((Vector3<float> *)0x7c1901);
  auVar45 = ZEXT856(extraout_XMM0_Qb);
  local_14 = local_14 * tVar7;
  auVar31 = (undefined1  [56])0x0;
  this_00 = (Transform *)(in_RDI + 0x78);
  r = local_10;
  VVar46 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff9e0);
  local_90 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar31;
  local_98 = vmovlpd_avx(auVar11._0_16_);
  local_84 = local_98;
  local_7c = local_90;
  MediumHandle::TaggedPointer((MediumHandle *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  Ray::Ray(in_stack_fffffffffffff9e0,(Point3f *)in_stack_fffffffffffff9d8,
           (Vector3f *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
           (Float)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
           (MediumHandle *)in_stack_fffffffffffff9c0);
  Transform::operator()(this_00,r,pFVar6);
  bVar1 = Bounds3<float>::IntersectP
                    (in_stack_fffffffffffffa08,&in_stack_fffffffffffffa00->o,
                     (Vector3f *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                     FVar10,in_stack_fffffffffffff9e8,(Float *)in_stack_fffffffffffff9e0);
  if (bVar1) {
    uVar51 = *(undefined4 *)(in_RDI + 0x70);
    auVar31 = (undefined1  [56])0x0;
    SVar49 = DenselySampledSpectrum::Sample
                       ((DenselySampledSpectrum *)in_stack_fffffffffffff9e0,
                        in_stack_fffffffffffff9d8);
    auVar32._0_8_ = SVar49.values.values._8_8_;
    auVar32._8_56_ = auVar45;
    auVar12._0_8_ = SVar49.values.values._0_8_;
    auVar12._8_56_ = auVar31;
    auVar31 = (undefined1  [56])0x0;
    local_c8 = vmovlpd_avx(auVar12._0_16_);
    local_c0 = vmovlpd_avx(auVar32._0_16_);
    SVar49 = pbrt::operator*((Float)((ulong)in_stack_fffffffffffff9c0 >> 0x20),
                             (SampledSpectrum *)in_stack_fffffffffffff9b8);
    auVar33._0_8_ = SVar49.values.values._8_8_;
    auVar33._8_56_ = auVar45;
    auVar13._0_8_ = SVar49.values.values._0_8_;
    auVar13._8_56_ = auVar31;
    local_b8 = vmovlpd_avx(auVar13._0_16_);
    local_b0 = vmovlpd_avx(auVar33._0_16_);
    uVar52 = *(undefined4 *)(in_RDI + 0x70);
    auVar31 = (undefined1  [56])0x0;
    SVar49 = DenselySampledSpectrum::Sample
                       ((DenselySampledSpectrum *)in_stack_fffffffffffff9e0,
                        in_stack_fffffffffffff9d8);
    auVar34._0_8_ = SVar49.values.values._8_8_;
    auVar34._8_56_ = auVar45;
    auVar14._0_8_ = SVar49.values.values._0_8_;
    auVar14._8_56_ = auVar31;
    auVar31 = (undefined1  [56])0x0;
    local_e8 = (FloatGrid *)vmovlpd_avx(auVar14._0_16_);
    local_e0 = (FloatGrid *)vmovlpd_avx(auVar34._0_16_);
    SVar49 = pbrt::operator*((Float)((ulong)in_stack_fffffffffffff9c0 >> 0x20),
                             (SampledSpectrum *)in_stack_fffffffffffff9b8);
    auVar35._0_8_ = SVar49.values.values._8_8_;
    auVar35._8_56_ = auVar45;
    auVar15._0_8_ = SVar49.values.values._0_8_;
    auVar15._8_56_ = auVar31;
    local_d8 = vmovlpd_avx(auVar15._0_16_);
    local_d0 = vmovlpd_avx(auVar35._0_16_);
    SVar49 = SampledSpectrum::operator+
                       ((SampledSpectrum *)in_stack_fffffffffffff9c8,
                        (SampledSpectrum *)in_stack_fffffffffffff9c0);
    auVar36._0_8_ = SVar49.values.values._8_8_;
    auVar36._8_56_ = auVar45;
    auVar16._0_8_ = SVar49.values.values._0_8_;
    auVar16._8_56_ = auVar31;
    local_f8 = vmovlpd_avx(auVar16._0_16_);
    local_f0 = (uint8_t *)vmovlpd_avx(auVar36._0_16_);
    VVar46 = Bounds3<float>::Diagonal
                       ((Bounds3<float> *)
                        CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
    local_140._48_4_ = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar17._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar31;
    local_140._40_8_ = vmovlpd_avx(auVar17._0_16_);
    local_108._vptr_GridHandleBase = (_func_int **)local_140._40_8_;
    local_100 = (float)local_140._48_4_;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffff9c0,
               (float)((ulong)in_stack_fffffffffffff9b8 >> 0x20),SUB84(in_stack_fffffffffffff9b8,0),
               0.0);
    lambda_00 = (SampledWavelengths *)(local_160 + 8);
    Vector3<float>::Vector3
              ((Vector3<float> *)in_stack_fffffffffffff9c0,
               (float)((ulong)in_stack_fffffffffffff9b8 >> 0x20),SUB84(in_stack_fffffffffffff9b8,0),
               0.0);
    p_00 = (Point3f *)local_160;
    MediumHandle::TaggedPointer((MediumHandle *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8)
    ;
    this_01 = (NanoVDBMediumProvider *)local_140;
    Ray::Ray(in_stack_fffffffffffff9e0,(Point3f *)in_stack_fffffffffffff9d8,
             (Vector3f *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
             (Float)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
             (MediumHandle *)in_stack_fffffffffffff9c0);
    auVar31 = (undefined1  [56])0x0;
    PVar47 = Ray::operator()(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc);
    local_180.z = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
    auVar18._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar18._8_56_ = auVar31;
    local_180._0_8_ = vmovlpd_avx(auVar18._0_16_);
    local_16c._0_8_ = local_180._0_8_;
    local_16c.z = local_180.z;
    Vector3<float>::Vector3
              ((Vector3<float> *)in_stack_fffffffffffff9c0,
               (float)((ulong)in_stack_fffffffffffff9b8 >> 0x20),SUB84(in_stack_fffffffffffff9b8,0),
               0.0);
    for (local_1cc = 0; local_1cc < 3; local_1cc = local_1cc + 1) {
      pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[]
                         ((Tuple3<pbrt::Vector3,_float> *)(local_140 + 0xc),local_1cc);
      if ((*pfVar4 == -0.0) && (!NAN(*pfVar4))) {
        pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[]
                           ((Tuple3<pbrt::Vector3,_float> *)(local_140 + 0xc),local_1cc);
        *pfVar4 = 0.0;
      }
      pfVar4 = Tuple3<pbrt::Point3,_float>::operator[](&local_16c,local_1cc);
      in_stack_fffffffffffffa68 = *pfVar4;
      iVar2 = Tuple3<pbrt::Point3,_int>::operator[]
                        ((Tuple3<pbrt::Point3,_int> *)(in_RDI + 0x198),local_1cc);
      in_stack_fffffffffffffa6c = in_stack_fffffffffffffa68 * (float)iVar2;
      iVar2 = Tuple3<pbrt::Point3,_int>::operator[]
                        ((Tuple3<pbrt::Point3,_int> *)(in_RDI + 0x198),local_1cc);
      fVar8 = Clamp<float,int,int>(in_stack_fffffffffffffa6c,0,iVar2 + -1);
      local_1bc[local_1cc] = (int)fVar8;
      pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[]
                         ((Tuple3<pbrt::Vector3,_float> *)(local_140 + 0xc),local_1cc);
      if (*pfVar4 < 0.0) {
        in_stack_fffffffffffffa40 = (float)local_1bc[local_1cc];
        iVar2 = Tuple3<pbrt::Point3,_int>::operator[]
                          ((Tuple3<pbrt::Point3,_int> *)(in_RDI + 0x198),local_1cc);
        in_stack_fffffffffffffa44 = in_stack_fffffffffffffa40 / (float)iVar2;
        in_stack_fffffffffffffa4c = local_a4;
        local_1d4 = in_stack_fffffffffffffa44;
        pfVar4 = Tuple3<pbrt::Point3,_float>::operator[](&local_16c,local_1cc);
        in_stack_fffffffffffffa48 = in_stack_fffffffffffffa44 - *pfVar4;
        pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[]
                           ((Tuple3<pbrt::Vector3,_float> *)(local_140 + 0xc),local_1cc);
        afStack_198[(long)local_1cc + 3] =
             in_stack_fffffffffffffa4c + in_stack_fffffffffffffa48 / *pfVar4;
        pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[](&local_1c8,local_1cc);
        fVar8 = *pfVar4;
        pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[]
                           ((Tuple3<pbrt::Vector3,_float> *)(local_140 + 0xc),local_1cc);
        afStack_198[local_1cc] = -fVar8 / *pfVar4;
        local_1bc[(long)local_1cc + 6] = -1;
        local_1bc[(long)local_1cc + 3] = -1;
      }
      else {
        iVar2 = local_1bc[local_1cc];
        iVar3 = Tuple3<pbrt::Point3,_int>::operator[]
                          ((Tuple3<pbrt::Point3,_int> *)(in_RDI + 0x198),local_1cc);
        fVar9 = (float)(iVar2 + 1) / (float)iVar3;
        in_stack_fffffffffffffa60 = local_a4;
        local_1d0 = fVar9;
        pfVar4 = Tuple3<pbrt::Point3,_float>::operator[](&local_16c,local_1cc);
        fVar8 = *pfVar4;
        pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[]
                           ((Tuple3<pbrt::Vector3,_float> *)(local_140 + 0xc),local_1cc);
        afStack_198[(long)local_1cc + 3] = in_stack_fffffffffffffa60 + (fVar9 - fVar8) / *pfVar4;
        pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[](&local_1c8,local_1cc);
        in_stack_fffffffffffffa64 = *pfVar4;
        pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[]
                           ((Tuple3<pbrt::Vector3,_float> *)(local_140 + 0xc),local_1cc);
        afStack_198[local_1cc] = in_stack_fffffffffffffa64 / *pfVar4;
        local_1bc[(long)local_1cc + 6] = 1;
        iVar2 = Tuple3<pbrt::Point3,_int>::operator[]
                          ((Tuple3<pbrt::Point3,_int> *)(in_RDI + 0x198),local_1cc);
        local_1bc[(long)local_1cc + 3] = iVar2;
      }
    }
    local_1d8 = local_a4;
    local_1dc = RNG::Uniform<float>((RNG *)in_stack_fffffffffffff9c0);
    while( true ) {
      local_1e0 = (uint)(afStack_198[3] < local_184) * 2 + (uint)(afStack_198[3] < local_188) * 4 |
                  (uint)(local_188 < local_184);
      local_208.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )0x100000002;
      aFStack_200[0] = 2.8026e-45;
      aFStack_200[1] = 1.4013e-45;
      pStack_1f8.memoryResource = (memory_resource *)0x200000002;
      pfStack_1f0 = (float *)0x0;
      local_228._28_4_ =
           *(Float *)((long)&local_208.
                             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                             .bits + (long)(int)local_1e0 * 4);
      local_228._24_4_ = afStack_198[(long)(int)local_228._28_4_ + 3];
      local_228._20_4_ =
           local_1bc[0] +
           *(int *)(in_RDI + 0x198) * (local_1bc[1] + *(int *)(in_RDI + 0x19c) * local_1bc[2]);
      auVar45 = (undefined1  [56])0x0;
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          (in_RDI + 0x178),(long)(int)local_228._20_4_);
      local_228._16_4_ = *pvVar5;
      auVar31 = (undefined1  [56])0x0;
      SVar49 = SampledSpectrum::operator*
                         ((SampledSpectrum *)in_stack_fffffffffffff9c0,
                          (Float)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
      auVar37._0_8_ = SVar49.values.values._8_8_;
      auVar37._8_56_ = auVar45;
      auVar19._0_8_ = SVar49.values.values._0_8_;
      auVar19._8_56_ = auVar31;
      local_228._0_8_ = vmovlpd_avx(auVar19._0_16_);
      local_228._8_8_ = vmovlpd_avx(auVar37._0_16_);
      pFVar6 = SampledSpectrum::operator[]
                         ((SampledSpectrum *)in_stack_fffffffffffff9c0,
                          (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
      if (0.0 < *pFVar6) {
        while( true ) {
          SampledSpectrum::operator[]
                    ((SampledSpectrum *)in_stack_fffffffffffff9c0,
                     (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
          local_22c = InvertExponentialSample(0.0,1.1400077e-38);
          fVar8 = local_1d8;
          if (local_22c <= local_1dc) break;
          fVar9 = local_1dc;
          SampledSpectrum::operator[]
                    ((SampledSpectrum *)in_stack_fffffffffffff9c0,
                     (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
          FVar10 = SampleExponential(0.0,1.1400327e-38);
          auVar31 = ZEXT856(extraout_XMM0_Qb_00);
          local_234 = fVar8 + FVar10;
          if (local_a8 <= local_234) {
            SampledSpectrum::SampledSpectrum
                      ((SampledSpectrum *)in_stack_fffffffffffff9c0,
                       (Float)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
            MediumSample::MediumSample
                      (in_stack_fffffffffffff9c0,(SampledSpectrum *)in_stack_fffffffffffff9b8);
            VolPathIntegrator::SampleLd::anon_class_32_4_b07b4888::operator()
                      ((anon_class_32_4_b07b4888 *)
                       CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                       (MediumSample *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40)
                      );
            MediumSample::~MediumSample((MediumSample *)0x7c23f9);
            return;
          }
          auVar45 = (undefined1  [56])0x0;
          PVar47 = Ray::operator()(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc);
          local_328._16_4_ = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
          auVar20._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar20._8_56_ = auVar45;
          local_328._8_8_ = vmovlpd_avx(auVar20._0_16_);
          in_stack_fffffffffffffa00 = (Ray *)local_228;
          local_310 = (memory_resource *)local_328._8_8_;
          local_308 = (float)local_328._16_4_;
          SVar49 = SampledSpectrum::operator-
                             ((SampledSpectrum *)
                              CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
          auVar38._0_8_ = SVar49.values.values._8_8_;
          auVar38._8_56_ = auVar31;
          auVar21._0_8_ = SVar49.values.values._0_8_;
          auVar21._8_56_ = auVar45;
          local_350._0_8_ = vmovlpd_avx(auVar21._0_16_);
          local_350.values.alloc.memoryResource = (memory_resource *)vmovlpd_avx(auVar38._0_16_);
          auVar45 = (undefined1  [56])0x0;
          auVar31 = (undefined1  [56])0x0;
          SVar49 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff9c0,
                              (Float)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
          auVar39._0_8_ = SVar49.values.values._8_8_;
          auVar39._8_56_ = auVar45;
          auVar22._0_8_ = SVar49.values.values._0_8_;
          auVar22._8_56_ = auVar31;
          local_350.values.ptr = (float *)vmovlpd_avx(auVar22._0_16_);
          local_350.values.nAlloc = vmovlpd_avx(auVar39._0_16_);
          SVar49 = FastExp((SampledSpectrum *)in_stack_fffffffffffff9c0);
          auVar40._0_8_ = SVar49.values.values._8_8_;
          auVar40._8_56_ = auVar45;
          auVar23._0_8_ = SVar49.values.values._0_8_;
          auVar23._8_56_ = auVar31;
          local_350.values.nStored = vmovlpd_avx(auVar23._0_16_);
          local_328._0_8_ = vmovlpd_avx(auVar40._0_16_);
          SVar49 = NanoVDBMediumProvider::Density
                             ((NanoVDBMediumProvider *)CONCAT44(uVar52,uVar51),
                              (Point3f *)
                              CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                              (SampledWavelengths *)
                              CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
          auVar41._0_8_ = SVar49.values.values._8_8_;
          auVar41._8_56_ = auVar45;
          auVar24._0_8_ = SVar49.values.values._0_8_;
          auVar24._8_56_ = auVar31;
          local_370._16_8_ = vmovlpd_avx(auVar24._0_16_);
          local_370._24_8_ = vmovlpd_avx(auVar41._0_16_);
          SVar49 = NanoVDBMediumProvider::Le(this_01,p_00,lambda_00);
          auVar42._0_8_ = SVar49.values.values._8_8_;
          auVar42._8_56_ = auVar45;
          auVar25._0_8_ = SVar49.values.values._0_8_;
          auVar25._8_56_ = auVar31;
          local_370._0_8_ = vmovlpd_avx(auVar25._0_16_);
          local_370._8_8_ = vmovlpd_avx(auVar42._0_16_);
          PVar48 = Transform::operator()
                             ((Transform *)in_stack_fffffffffffffb70,
                              (Point3<float> *)in_stack_fffffffffffffb68);
          auVar26._0_8_ = PVar48.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar26._8_56_ = auVar31;
          vmovlpd_avx(auVar26._0_16_);
          VVar46 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff9e0);
          auVar27._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar27._8_56_ = auVar31;
          vmovlpd_avx(auVar27._0_16_);
          VVar46 = Tuple3<pbrt::Vector3,_float>::operator-
                             ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff9c0);
          auVar28._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar28._8_56_ = auVar31;
          vmovlpd_avx(auVar28._0_16_);
          in_stack_fffffffffffff9fc = local_10->time;
          auVar31 = (undefined1  [56])0x0;
          in_stack_fffffffffffff9e0 = (Ray *)(local_370 + 0x10);
          SVar49 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff9c8,
                              (SampledSpectrum *)in_stack_fffffffffffff9c0);
          auVar43._0_8_ = SVar49.values.values._8_8_;
          auVar43._8_56_ = auVar45;
          auVar29._0_8_ = SVar49.values.values._0_8_;
          auVar29._8_56_ = auVar31;
          vmovlpd_avx(auVar29._0_16_);
          vmovlpd_avx(auVar43._0_16_);
          SVar49 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff9c8,
                              (SampledSpectrum *)in_stack_fffffffffffff9c0);
          auVar44._0_8_ = SVar49.values.values._8_8_;
          auVar44._8_56_ = auVar45;
          auVar30._0_8_ = SVar49.values.values._0_8_;
          auVar30._8_56_ = auVar31;
          vmovlpd_avx(auVar30._0_16_);
          vmovlpd_avx(auVar44._0_16_);
          pMVar50 = (MediumSample *)&stack0xfffffffffffffb70;
          MediumHandle::TaggedPointer<pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>const>
                    ((MediumHandle *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
          in_stack_fffffffffffff9c8 = (MediumInteraction *)&stack0xfffffffffffffb68;
          PhaseFunctionHandle::TaggedPointer<pbrt::HGPhaseFunction_const>
                    ((PhaseFunctionHandle *)in_stack_fffffffffffff9c0,
                     (HGPhaseFunction *)in_stack_fffffffffffff9b8);
          in_stack_fffffffffffff9c0 = pMVar50;
          in_stack_fffffffffffff9b8 = (GeneralMedium<pbrt::NanoVDBMediumProvider> *)local_370;
          MediumInteraction::MediumInteraction
                    (in_stack_fffffffffffffa10,local_408,(Vector3f *)in_stack_fffffffffffffa00,
                     in_stack_fffffffffffff9fc,(SampledSpectrum *)in_stack_fffffffffffff9c0,
                     (SampledSpectrum *)in_stack_fffffffffffff9c8,
                     (SampledSpectrum *)in_stack_fffffffffffff9e0,in_stack_fffffffffffffa20,
                     in_stack_fffffffffffffa28,
                     (PhaseFunctionHandle *)CONCAT44(fVar9,in_stack_fffffffffffffa30));
          in_stack_fffffffffffffa10 = &local_548;
          MediumSample::MediumSample
                    ((MediumSample *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                     in_stack_fffffffffffff9c8,(SampledSpectrum *)in_stack_fffffffffffff9c0);
          bVar1 = VolPathIntegrator::SampleLd::anon_class_32_4_b07b4888::operator()
                            ((anon_class_32_4_b07b4888 *)
                             CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                             (MediumSample *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
          in_stack_fffffffffffff9d7 = bVar1 ^ 0xff;
          MediumSample::~MediumSample((MediumSample *)0x7c2755);
          if ((in_stack_fffffffffffff9d7 & 1) != 0) {
            return;
          }
          local_1dc = RNG::Uniform<float>((RNG *)in_stack_fffffffffffff9c0);
          local_1d8 = local_234;
        }
        local_230 = (local_1dc - local_22c) / (1.0 - local_22c);
        pfVar4 = std::min<float>(&local_230,(float *)&OneMinusEpsilon);
        local_1dc = *pfVar4;
      }
      if ((local_a8 < afStack_198[(long)(int)local_228._28_4_ + 3]) ||
         (local_1bc[(int)local_228._28_4_] =
               local_1bc[(long)(int)local_228._28_4_ + 6] + local_1bc[(int)local_228._28_4_],
         local_1bc[(int)local_228._28_4_] == local_1bc[(long)(int)local_228._28_4_ + 3])) break;
      afStack_198[(long)(int)local_228._28_4_ + 3] =
           afStack_198[(int)local_228._28_4_] + afStack_198[(long)(int)local_228._28_4_ + 3];
      local_1d8 = (float)local_228._24_4_;
    }
  }
  return;
}

Assistant:

PBRT_CPU_GPU void SampleTmaj(const Ray &rRender, Float raytMax, RNG &rng,
                                 const SampledWavelengths &lambda, F callback) const {
        // Transform ray to grid density's space and compute bounds overlap
        raytMax *= Length(rRender.d);
        Ray ray = mediumFromRender(Ray(rRender.o, Normalize(rRender.d)), &raytMax);
        Float tMin, tMax;
        if (!mediumBounds.IntersectP(ray.o, ray.d, raytMax, &tMin, &tMax))
            return;
        DCHECK_LE(tMax, raytMax);

        // Sample spectra for grid medium scattering
        SampledSpectrum sigma_a = sigScale * sigma_a_spec.Sample(lambda);
        SampledSpectrum sigma_s = sigScale * sigma_s_spec.Sample(lambda);
        SampledSpectrum sigma_t = sigma_a + sigma_s;

        // Set up 3D DDA for ray through grid
        Vector3f diag = mediumBounds.Diagonal();
        Ray rayGrid(Point3f((ray.o.x - mediumBounds.pMin.x) / diag.x,
                            (ray.o.y - mediumBounds.pMin.y) / diag.y,
                            (ray.o.z - mediumBounds.pMin.z) / diag.z),
                    Vector3f(ray.d.x / diag.x, ray.d.y / diag.y, ray.d.z / diag.z));
        Point3f gridIntersect = rayGrid(tMin);
        float nextCrossingT[3], deltaT[3];
        int step[3], voxelLimit[3], voxel[3];
        Vector3f voxelWidth(1.f / gridResolution.x, 1.f / gridResolution.y,
                            1.f / gridResolution.z);
        for (int axis = 0; axis < 3; ++axis) {
            // Initialize ray stepping parameters for axis
            // Handle negative zero ray direction
            if (rayGrid.d[axis] == -0.f)
                rayGrid.d[axis] = 0.f;

            // Compute current voxel for axis
            voxel[axis] = Clamp(gridIntersect[axis] * gridResolution[axis], 0,
                                gridResolution[axis] - 1);

            if (rayGrid.d[axis] >= 0) {
                // Handle ray with positive direction for voxel stepping
                Float nextVoxelPos = Float(voxel[axis] + 1) / gridResolution[axis];
                nextCrossingT[axis] =
                    tMin + (nextVoxelPos - gridIntersect[axis]) / rayGrid.d[axis];
                deltaT[axis] = voxelWidth[axis] / rayGrid.d[axis];
                step[axis] = 1;
                voxelLimit[axis] = gridResolution[axis];

            } else {
                // Handle ray with negative direction for voxel stepping
                Float nextVoxelPos = Float(voxel[axis]) / gridResolution[axis];
                nextCrossingT[axis] =
                    tMin + (nextVoxelPos - gridIntersect[axis]) / rayGrid.d[axis];
                deltaT[axis] = -voxelWidth[axis] / rayGrid.d[axis];
                step[axis] = -1;
                voxelLimit[axis] = -1;
            }
        }

        // Walk ray through maximum density grid and sample scattering
        Float t0 = tMin, u = rng.Uniform<Float>();
        while (true) {
            // Find _stepAxis_ for stepping to next voxel and exit point _t1_
            int bits = ((nextCrossingT[0] < nextCrossingT[1]) << 2) +
                       ((nextCrossingT[0] < nextCrossingT[2]) << 1) +
                       ((nextCrossingT[1] < nextCrossingT[2]));
            const int cmpToAxis[8] = {2, 1, 2, 1, 2, 2, 0, 0};
            int stepAxis = cmpToAxis[bits];
            Float t1 = nextCrossingT[stepAxis];

            // Sample volume scattering in current voxel
            // Get _maxDensity_ for current voxel and compute _sigma_maj_
            int offset =
                voxel[0] + gridResolution.x * (voxel[1] + gridResolution.y * voxel[2]);
            Float maxDensity = maxDensityGrid[offset];
            SampledSpectrum sigma_maj(sigma_t * maxDensity);

            if (sigma_maj[0] > 0) {
                while (true) {
                    // Sample medium in current voxel
                    // Compute _uEnd_ for exiting voxel and continue if no valid event
                    Float uEnd = InvertExponentialSample(t1 - t0, sigma_maj[0]);
                    if (u >= uEnd) {
                        u = std::min((u - uEnd) / (1 - uEnd), OneMinusEpsilon);
                        break;
                    }

                    // Sample _t_ for scattering event and check validity
                    Float t = t0 + SampleExponential(u, sigma_maj[0]);
                    if (t >= tMax) {
                        callback(MediumSample(SampledSpectrum(1.f)));
                        return;
                    }

                    // Report scattering event in grid to callback function
                    Point3f p = ray(t);
                    SampledSpectrum Tmaj = FastExp(-sigma_maj * (t - t0));
                    // Compute _density_ and _Le_ at sampled point in grid
                    SampledSpectrum density = provider->Density(p, lambda);
                    SampledSpectrum Le = provider->Le(p, lambda);

                    MediumInteraction intr(renderFromMedium(p), -Normalize(rRender.d),
                                           rRender.time, sigma_a * density,
                                           sigma_s * density, sigma_maj, Le, this,
                                           &phase);
                    if (!callback(MediumSample(intr, Tmaj)))
                        return;

                    // Update _u_ and _t0_ after grid medium event
                    u = rng.Uniform<Float>();
                    t0 = t;
                }
            }

            // Advance to next voxel in maximum density grid
            if (nextCrossingT[stepAxis] > tMax)
                return;
            voxel[stepAxis] += step[stepAxis];
            if (voxel[stepAxis] == voxelLimit[stepAxis])
                return;
            nextCrossingT[stepAxis] += deltaT[stepAxis];
            t0 = t1;
        }
    }